

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O1

int find_column(ParseData *lParse,char *colName,void *itslval)

{
  DataInfo *pDVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  PixelFilter *pPVar5;
  uint uVar6;
  long lVar7;
  fitsfile *infptr;
  long lVar8;
  iteratorCol *colIter;
  int colnum;
  int status;
  int typecode;
  int istatus;
  double tscale;
  double tzero;
  long repeat;
  long width;
  char temp [80];
  uint local_d4;
  int local_d0;
  int local_cc;
  iteratorCol *local_c8;
  DataInfo *local_c0;
  int local_b4;
  double local_b0;
  double local_a8;
  long local_a0;
  long local_98;
  long local_90;
  char local_88 [88];
  
  if (DEBUG_PIXFILTER != 0) {
    printf("find_column(%s)\n");
  }
  if (*colName == '#') {
    iVar3 = find_keywd(lParse,colName + 1,itslval);
    return iVar3;
  }
  infptr = lParse->def_fptr;
  local_d0 = 0;
  iVar3 = lParse->nCols;
  lVar7 = (long)iVar3;
  if (lParse->hdutype == 0) {
    local_98 = lVar7;
    if (lParse->pixFilter == (PixelFilter *)0x0) {
      lParse->status = 0xdb;
      ffpmsg("find_column: IMAGE_HDU but no PixelFilter");
LAB_0012320d:
      bVar2 = false;
    }
    else {
      local_d4 = 0xffffffff;
      pPVar5 = lParse->pixFilter;
      if (0 < pPVar5->count) {
        lVar8 = 0;
        do {
          iVar4 = fits_strcasecmp(colName,pPVar5->tag[lVar8]);
          if (iVar4 == 0) {
            local_d4 = (uint)lVar8;
          }
          lVar8 = lVar8 + 1;
          pPVar5 = lParse->pixFilter;
        } while (lVar8 < pPVar5->count);
      }
      if ((int)local_d4 < 0) {
        bVar2 = false;
        snprintf(local_88,0x50,"find_column: PixelFilter tag %s not found",colName);
        ffpmsg(local_88);
        lParse->status = 0xdb;
      }
      else {
        iVar3 = fits_parser_allocateCol(lParse,iVar3,&lParse->status);
        if (iVar3 != 0) goto LAB_0012320d;
        pDVar1 = lParse->varData;
        local_c0 = pDVar1 + lVar7;
        colIter = lParse->colData + lVar7;
        infptr = lParse->pixFilter->ifptr[(int)local_d4];
        ffgipr(infptr,5,&local_cc,&pDVar1[lVar7].naxis,pDVar1[lVar7].naxes,&local_d0);
        pDVar1[lVar7].naxes[-2] = 1;
        iVar3 = set_image_col_types(lParse,infptr,colName,local_cc,local_c0,colIter);
        local_c8 = colIter;
        if (iVar3 == 0) {
          colIter->fptr = infptr;
          colIter->iotype = 0;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
      }
    }
    lVar7 = local_98;
    if (!bVar2) {
      return -1;
    }
LAB_00123259:
    pDVar1 = local_c0;
    strncpy(local_c0->name,colName,0x50);
    pDVar1->name[0x50] = '\0';
    iVar3 = lParse->hdutype;
    if (iVar3 == 0) {
      iVar4 = 0x10e;
    }
    else {
      if (0xf < local_cc) {
        uVar6 = local_cc - 0x15;
        if (uVar6 < 0x3e) {
          if ((0x3000000000200000U >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
            pDVar1->type = 0x104;
            local_c8->datatype = 0x52;
            goto LAB_001234db;
          }
          if ((0x100001UL >> ((ulong)uVar6 & 0x3f) & 1) != 0) goto LAB_0012330e;
        }
        if (local_cc == 0x10) {
          pDVar1->type = 0x105;
          local_c8->datatype = 0x10;
          if (local_90 < 0x100) {
            iVar4 = 0x110;
            if (iVar3 == 1) {
              local_a0 = local_90;
            }
            goto LAB_001234e1;
          }
          snprintf(local_88,0x50,"column %d is wider than maximum %d characters",(ulong)local_d4,
                   0xff);
          ffpmsg(local_88);
          lParse->status = 0x1b1;
        }
        else {
LAB_00123497:
          if (local_cc < 0) {
            snprintf(local_88,0x50,"variable-length array columns are not supported. typecode = %d")
            ;
            ffpmsg(local_88);
          }
          lParse->status = 0x1b0;
        }
        goto LAB_00123028;
      }
      if (local_cc == 1) {
        pDVar1->type = 0x106;
        local_c8->datatype = 0xb;
        iVar4 = 0x111;
      }
      else if (local_cc == 0xb) {
LAB_0012330e:
        snprintf(local_88,0x50,"TZERO%d",(ulong)local_d4);
        local_b4 = 0;
        iVar3 = ffgky(infptr,0x52,local_88,&local_a8,(char *)0x0,&local_b4);
        if (iVar3 != 0) {
          local_a8 = 0.0;
        }
        snprintf(local_88,0x50,"TSCAL%d",(ulong)local_d4);
        local_b4 = 0;
        iVar3 = ffgky(infptr,0x52,local_88,&local_b0,(char *)0x0,&local_b4);
        if (iVar3 != 0) {
          local_b0 = 1.0;
        }
        if (((local_b0 != 1.0) || (NAN(local_b0))) ||
           (((local_a8 != 0.0 || (NAN(local_a8))) && ((local_a8 != 32768.0 || (NAN(local_a8))))))) {
          pDVar1->type = 0x104;
          local_c8->datatype = 0x52;
        }
        else {
          pDVar1->type = 0x103;
          local_c8->datatype = 0x29;
        }
LAB_001234db:
        iVar4 = 0x10e;
      }
      else {
        if (local_cc != 0xe) goto LAB_00123497;
        pDVar1->type = 0x102;
        local_c8->datatype = 0xe;
        iVar4 = 0x10f;
      }
LAB_001234e1:
      pDVar1->nelem = local_a0;
      local_c8->repeat = 0;
      if ((local_a0 < 2) || (local_cc == 0x10)) {
        pDVar1->naxis = 1;
        pDVar1->naxes[0] = 1;
      }
      else {
        iVar3 = ffgtdm(infptr,local_d4,5,&pDVar1->naxis,pDVar1->naxes,&local_d0);
        if (iVar3 != 0) goto LAB_00123022;
      }
    }
    lParse->nCols = lParse->nCols + 1;
    *(long *)itslval = lVar7;
  }
  else {
    if (lParse->compressed == 0) {
      iVar4 = ffgcno(infptr,0,colName,(int *)&local_d4,&local_d0);
      if (iVar4 == 0) goto LAB_00122ff6;
      if (local_d0 == 0xdb) {
        iVar3 = find_keywd(lParse,colName,itslval);
        if (iVar3 == -1) {
          return -1;
        }
        ffcmsg();
        return iVar3;
      }
    }
    else {
      local_d4 = lParse->valCol;
LAB_00122ff6:
      iVar4 = ffgtcl(infptr,local_d4,&local_cc,&local_a0,&local_90,&local_d0);
      if (iVar4 == 0) {
        iVar3 = fits_parser_allocateCol(lParse,iVar3,&lParse->status);
        if (iVar3 != 0) {
          return -1;
        }
        local_c0 = lParse->varData + lVar7;
        local_c8 = lParse->colData + lVar7;
        fits_iter_set_by_num(local_c8,infptr,local_d4,0,0);
        goto LAB_00123259;
      }
    }
LAB_00123022:
    lParse->status = local_d0;
LAB_00123028:
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

static int find_column( ParseData *lParse, char *colName, void *itslval )
{
   FITS_PARSER_YYSTYPE *thelval = (FITS_PARSER_YYSTYPE*)itslval;
   int col_cnt, status;
   int colnum, typecode, type;
   long repeat, width;
   fitsfile *fptr;
   char temp[80];
   double tzero,tscale;
   int istatus;
   DataInfo *varInfo;
   iteratorCol *colIter;

if (DEBUG_PIXFILTER)
   printf("find_column(%s)\n", colName);

   if( *colName == '#' )
     return( find_keywd( lParse, colName + 1, itslval ) );

   fptr = lParse->def_fptr;

   status = 0;
   col_cnt = lParse->nCols;

if (lParse->hdutype == IMAGE_HDU) {
   int i;
   if (!lParse->pixFilter) {
      lParse->status = COL_NOT_FOUND;
      ffpmsg("find_column: IMAGE_HDU but no PixelFilter");
      return pERROR;
   }

   colnum = -1;
   for (i = 0; i < lParse->pixFilter->count; ++i) {
      if (!fits_strcasecmp(colName, lParse->pixFilter->tag[i]))
         colnum = i;
   }
   if (colnum < 0) {
      snprintf(temp, 80, "find_column: PixelFilter tag %s not found", colName);
      ffpmsg(temp);
      lParse->status = COL_NOT_FOUND;
      return pERROR;
   }

   if( fits_parser_allocateCol( lParse, col_cnt, &lParse->status ) ) return pERROR;

   varInfo = lParse->varData + col_cnt;
   colIter = lParse->colData + col_cnt;

   fptr = lParse->pixFilter->ifptr[colnum];
   fits_get_img_param(fptr,
                MAXDIMS,
                &typecode, /* actually bitpix */
                &varInfo->naxis,
                &varInfo->naxes[0],
                &status);
   varInfo->nelem = 1;
   type = COLUMN;
   if (set_image_col_types(lParse, fptr, colName, typecode, varInfo, colIter))
      return pERROR;
   colIter->fptr = fptr;
   colIter->iotype = InputCol;
}
else { /* HDU holds a table */
   if( lParse->compressed )
      colnum = lParse->valCol;
   else
      if( fits_get_colnum( fptr, CASEINSEN, colName, &colnum, &status ) ) {
         if( status == COL_NOT_FOUND ) {
	   type = find_keywd( lParse, colName, itslval );
            if( type != pERROR ) ffcmsg();
            return( type );
         }
         lParse->status = status;
         return pERROR;
      }
   
   if( fits_get_coltype( fptr, colnum, &typecode,
                         &repeat, &width, &status ) ) {
      lParse->status = status;
      return pERROR;
   }

   if( fits_parser_allocateCol( lParse, col_cnt, &lParse->status ) ) return pERROR;

   varInfo = lParse->varData + col_cnt;
   colIter = lParse->colData + col_cnt;

   fits_iter_set_by_num( colIter, fptr, colnum, 0, InputCol );
}

   /*  Make sure we don't overflow variable name array  */
   strncpy(varInfo->name,colName,MAXVARNAME);
   varInfo->name[MAXVARNAME] = '\0';

if (lParse->hdutype != IMAGE_HDU) {
   switch( typecode ) {
   case TBIT:
      varInfo->type     = BITSTR;
      colIter->datatype = TBYTE;
      type = BITCOL;
      break;
   case TBYTE:
   case TSHORT:
   case TLONG:
      /* The datatype of column with TZERO and TSCALE keywords might be 
         float or double. 
      */
      snprintf(temp,80,"TZERO%d",colnum);
      istatus = 0;
      if(fits_read_key(fptr,TDOUBLE,temp,&tzero,NULL,&istatus)) {
          tzero = 0.0;
      } 
      snprintf(temp,80,"TSCAL%d",colnum);
      istatus = 0;
      if(fits_read_key(fptr,TDOUBLE,temp,&tscale,NULL,&istatus)) {
          tscale = 1.0;
      } 
      if (tscale == 1.0 && (tzero == 0.0 || tzero == 32768.0 )) {
          varInfo->type     = LONG;
          colIter->datatype = TLONG;
/*    Reading an unsigned long column as a long can cause overflow errors.
      Treat the column as a double instead.
      } else if (tscale == 1.0 &&  tzero == 2147483648.0 ) {
          varInfo->type     = LONG;
          colIter->datatype = TULONG;
 */

      }
      else {
          varInfo->type     = DOUBLE;
          colIter->datatype = TDOUBLE;
      }
      type = COLUMN;
      break;
/* 
  For now, treat 8-byte integer columns as type double.
  This can lose precision, so the better long term solution
  will be to add support for TLONGLONG as a separate datatype.
*/
   case TLONGLONG:
   case TFLOAT:
   case TDOUBLE:
      varInfo->type     = DOUBLE;
      colIter->datatype = TDOUBLE;
      type = COLUMN;
      break;
   case TLOGICAL:
      varInfo->type     = BOOLEAN;
      colIter->datatype = TLOGICAL;
      type = BCOLUMN;
      break;
   case TSTRING:
      varInfo->type     = STRING;
      colIter->datatype = TSTRING;
      type = SCOLUMN;
      if ( width >= MAX_STRLEN ) {
	snprintf(temp, 80, "column %d is wider than maximum %d characters",
		colnum, MAX_STRLEN-1);
        ffpmsg(temp);
	lParse->status = PARSE_LRG_VECTOR;
	return pERROR;
      }
      if( lParse->hdutype == ASCII_TBL ) repeat = width;
      break;
   default:
      if (typecode < 0) {
        snprintf(temp, 80,"variable-length array columns are not supported. typecode = %d", typecode);
        ffpmsg(temp);
      }
      lParse->status = PARSE_BAD_TYPE;
      return pERROR;
   }
   varInfo->nelem = repeat;
   colIter->repeat = 0; /* ffiter() will fill in this value */
   if( repeat>1 && typecode!=TSTRING ) {
      if( fits_read_tdim( fptr, colnum, MAXDIMS,
                          &varInfo->naxis,
                          &varInfo->naxes[0], &status )
          ) {
         lParse->status = status;
         return pERROR;
      }
   } else {
      varInfo->naxis = 1;
      varInfo->naxes[0] = 1;
   }
}
   lParse->nCols++;
   thelval->lng = col_cnt;

   return( type );
}